

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O3

void ncnn::innerproduct_transform_kernel_fp16s_sse_f16c
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  unsigned_short uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  unsigned_short *puVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint local_d8;
  long local_c0;
  Mat local_b0;
  void *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (opt->use_packing_layout == true) {
    if ((num_output & 7U) == 0) {
      Mat::reshape(&local_b0,weight_data,num_input,num_output,(Allocator *)0x0);
      Mat::create(weight_data_tm,num_input,num_output >> 3,0x10,8,(Allocator *)0x0);
      if (7 < num_output) {
        lVar17 = 1;
        lVar19 = 2;
        lVar21 = 3;
        lVar27 = 4;
        lVar23 = 5;
        lVar10 = 6;
        local_c0 = 7;
        lVar30 = 0;
        uVar31 = 0;
        do {
          pvVar6 = local_b0.data;
          pvVar1 = weight_data_tm->data;
          puVar12 = (unsigned_short *)
                    ((uVar31 >> 3) * (long)weight_data_tm->w * weight_data_tm->elemsize +
                    (long)pvVar1);
          lVar25 = (long)local_b0.w;
          if (num_input < 8) {
            lVar25 = local_b0.elemsize * lVar25;
            lVar26 = lVar25 * uVar31;
            lVar16 = (uVar31 | 1) * lVar25;
            lVar18 = (uVar31 | 2) * lVar25;
            lVar20 = (uVar31 | 3) * lVar25;
            lVar22 = (uVar31 | 4) * lVar25;
            lVar24 = (uVar31 | 5) * lVar25;
            lVar29 = (uVar31 | 6) * lVar25;
            lVar25 = lVar25 * (uVar31 | 7);
            uVar8 = 0;
          }
          else {
            lVar15 = weight_data_tm->elemsize * lVar30 * (long)weight_data_tm->w;
            lVar26 = local_b0.elemsize * uVar31 * lVar25;
            lVar16 = local_b0.elemsize * lVar17 * lVar25;
            lVar18 = local_b0.elemsize * lVar19 * lVar25;
            lVar20 = local_b0.elemsize * lVar21 * lVar25;
            lVar22 = local_b0.elemsize * lVar27 * lVar25;
            lVar24 = local_b0.elemsize * lVar23 * lVar25;
            lVar29 = local_b0.elemsize * lVar10 * lVar25;
            lVar25 = local_b0.elemsize * local_c0 * lVar25;
            local_68 = local_b0.data;
            iVar28 = 7;
            lVar9 = 0;
            do {
              auVar32 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar26),
                                       3);
              auVar34 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar16),
                                       3);
              auVar36 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar18),
                                       3);
              auVar37 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar20),
                                       3);
              auVar38 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar22),
                                       3);
              auVar39 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar24),
                                       3);
              auVar40 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar29),
                                       3);
              auVar41 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_b0.data + lVar9 + lVar25),
                                       3);
              auVar4 = vpunpcklwd_avx(auVar32,auVar34);
              auVar32 = vpunpckhwd_avx(auVar32,auVar34);
              auVar5 = vpunpcklwd_avx(auVar36,auVar37);
              auVar34 = vpunpckhwd_avx(auVar36,auVar37);
              auVar3 = vpunpcklwd_avx(auVar38,auVar39);
              auVar36 = vpunpckhwd_avx(auVar38,auVar39);
              auVar38 = vpunpcklwd_avx(auVar40,auVar41);
              auVar37 = vpunpckhwd_avx(auVar40,auVar41);
              auVar39 = vpunpckldq_avx(auVar4,auVar5);
              auVar4 = vpunpckhdq_avx(auVar4,auVar5);
              auVar5 = vpunpckldq_avx(auVar32,auVar34);
              auVar32 = vpunpckhdq_avx(auVar32,auVar34);
              auVar40 = vpunpckldq_avx(auVar3,auVar38);
              auVar34 = vpunpckhdq_avx(auVar3,auVar38);
              auVar3 = vpunpckldq_avx(auVar36,auVar37);
              auVar36 = vpunpckhdq_avx(auVar36,auVar37);
              auVar38 = vpunpcklqdq_avx(auVar39,auVar40);
              auVar37 = vpunpckhqdq_avx(auVar39,auVar40);
              auVar39 = vpunpcklqdq_avx(auVar4,auVar34);
              auVar34 = vpunpckhqdq_avx(auVar4,auVar34);
              auVar40 = vpunpcklqdq_avx(auVar5,auVar3);
              auVar4 = vpunpckhqdq_avx(auVar5,auVar3);
              auVar5 = vpunpcklqdq_avx(auVar32,auVar36);
              auVar32 = vpunpckhqdq_avx(auVar32,auVar36);
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15) = auVar38;
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15 + 0x10) = auVar37;
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15 + 0x20) = auVar39;
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15 + 0x30) = auVar34;
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15 + 0x40) = auVar40;
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15 + 0x50) = auVar4;
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15 + 0x60) = auVar5;
              *(undefined1 (*) [16])((long)pvVar1 + lVar9 * 4 + lVar15 + 0x70) = auVar32;
              puVar12 = puVar12 + 0x40;
              lVar9 = lVar9 + 0x20;
              iVar28 = iVar28 + 8;
            } while (iVar28 < num_input);
            lVar26 = lVar26 + lVar9;
            lVar16 = lVar16 + lVar9;
            lVar18 = lVar18 + lVar9;
            lVar20 = lVar20 + lVar9;
            lVar22 = lVar22 + lVar9;
            lVar24 = lVar24 + lVar9;
            lVar29 = lVar29 + lVar9;
            lVar25 = lVar25 + lVar9;
            uVar8 = num_input & 0xfffffff8;
          }
          local_60 = uVar31;
          local_58 = lVar30;
          local_50 = lVar10;
          local_48 = lVar23;
          local_40 = lVar27;
          local_38 = lVar21;
          if ((int)uVar8 < num_input) {
            lVar21 = 0;
            do {
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar26));
              *puVar12 = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar16));
              puVar12[1] = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar18));
              puVar12[2] = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar20));
              puVar12[3] = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar22));
              puVar12[4] = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar24));
              puVar12[5] = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar29));
              puVar12[6] = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar21 * 4 + lVar25));
              puVar12[7] = uVar7;
              puVar12 = puVar12 + 8;
              lVar21 = lVar21 + 1;
            } while (num_input - uVar8 != (int)lVar21);
          }
          uVar31 = local_60 + 8;
          lVar30 = local_58 + 1;
          lVar17 = lVar17 + 8;
          lVar19 = lVar19 + 8;
          lVar21 = local_38 + 8;
          lVar27 = local_40 + 8;
          lVar23 = local_48 + 8;
          lVar10 = local_50 + 8;
          local_c0 = local_c0 + 8;
        } while ((int)((uint)uVar31 | 7) < num_output);
      }
      if (local_b0.refcount == (int *)0x0) {
        return;
      }
      LOCK();
      *local_b0.refcount = *local_b0.refcount + -1;
      UNLOCK();
      if (*local_b0.refcount != 0) {
        return;
      }
      if (local_b0.allocator != (Allocator *)0x0) {
        (*(local_b0.allocator)->_vptr_Allocator[3])();
        return;
      }
      goto LAB_00328559;
    }
    if ((num_output & 3U) == 0) {
      Mat::reshape(&local_b0,weight_data,num_input,num_output,(Allocator *)0x0);
      Mat::create(weight_data_tm,num_input,num_output >> 2,8,4,(Allocator *)0x0);
      if (3 < num_output) {
        local_d8 = num_input & 0xfffffffc;
        lVar17 = 3;
        lVar19 = 2;
        lVar21 = 1;
        lVar27 = 0;
        uVar31 = 0;
        do {
          pvVar6 = local_b0.data;
          iVar28 = weight_data_tm->w;
          pvVar1 = weight_data_tm->data;
          sVar2 = weight_data_tm->elemsize;
          pauVar13 = (undefined1 (*) [16])((uVar31 >> 2) * (long)iVar28 * sVar2 + (long)pvVar1);
          lVar23 = (long)local_b0.w;
          if (num_input < 4) {
            lVar23 = local_b0.elemsize * lVar23;
            lVar26 = lVar23 * uVar31;
            lVar25 = (uVar31 | 1) * lVar23;
            lVar30 = (uVar31 | 2) * lVar23;
            lVar10 = lVar23 * (uVar31 | 3);
            uVar8 = 0;
          }
          else {
            lVar10 = local_b0.elemsize * lVar17 * lVar23;
            lVar30 = local_b0.elemsize * lVar19 * lVar23;
            lVar25 = local_b0.elemsize * lVar21 * lVar23;
            lVar23 = local_b0.elemsize * uVar31 * lVar23;
            iVar11 = 3;
            lVar26 = 0;
            do {
              pauVar14 = pauVar13;
              auVar32 = *(undefined1 (*) [16])((long)local_b0.data + lVar26 + lVar23);
              auVar34 = *(undefined1 (*) [16])((long)local_b0.data + lVar26 + lVar25);
              auVar36 = *(undefined1 (*) [16])((long)local_b0.data + lVar26 + lVar30);
              auVar37 = *(undefined1 (*) [16])((long)local_b0.data + lVar26 + lVar10);
              auVar4 = vpunpckldq_avx(auVar32,auVar34);
              auVar5 = vpunpckldq_avx(auVar36,auVar37);
              auVar32 = vpunpckhdq_avx(auVar32,auVar34);
              auVar34 = vpunpckhdq_avx(auVar36,auVar37);
              auVar37 = vpunpcklqdq_avx(auVar4,auVar5);
              auVar36 = vpunpckhqdq_avx(auVar4,auVar5);
              auVar4 = vpunpcklqdq_avx(auVar32,auVar34);
              auVar32 = vpunpckhqdq_avx(auVar32,auVar34);
              auVar35._16_16_ = auVar36;
              auVar35._0_16_ = auVar37;
              auVar33._16_16_ = auVar32;
              auVar33._0_16_ = auVar4;
              pauVar13 = (undefined1 (*) [16])
                         ((long)pvVar1 + lVar26 * 2 + sVar2 * lVar27 * (long)iVar28);
              auVar32 = vcvtps2ph_f16c(auVar35,3);
              *pauVar13 = auVar32;
              auVar32 = vcvtps2ph_f16c(auVar33,3);
              pauVar13[1] = auVar32;
              iVar11 = iVar11 + 4;
              lVar26 = lVar26 + 0x10;
              pauVar13 = pauVar13 + 2;
            } while (iVar11 < num_input);
            pauVar13 = pauVar14 + 2;
            lVar10 = lVar10 + lVar26;
            lVar30 = lVar30 + lVar26;
            lVar25 = lVar25 + lVar26;
            lVar26 = lVar23 + lVar26;
            uVar8 = local_d8;
          }
          if ((int)uVar8 < num_input) {
            lVar23 = 0;
            do {
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar23 * 4 + lVar26));
              *(unsigned_short *)(*pauVar13 + lVar23 * 8) = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar23 * 4 + lVar25));
              *(unsigned_short *)(*pauVar13 + lVar23 * 8 + 2) = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar23 * 4 + lVar30));
              *(unsigned_short *)(*pauVar13 + lVar23 * 8 + 4) = uVar7;
              uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar23 * 4 + lVar10));
              *(unsigned_short *)(*pauVar13 + lVar23 * 8 + 6) = uVar7;
              lVar23 = lVar23 + 1;
            } while (num_input - uVar8 != (int)lVar23);
          }
          uVar31 = uVar31 + 4;
          lVar17 = lVar17 + 4;
          lVar19 = lVar19 + 4;
          lVar21 = lVar21 + 4;
          lVar27 = lVar27 + 1;
        } while ((int)((uint)uVar31 | 3) < num_output);
      }
      if (local_b0.refcount == (int *)0x0) {
        return;
      }
      LOCK();
      *local_b0.refcount = *local_b0.refcount + -1;
      UNLOCK();
      if (*local_b0.refcount != 0) {
        return;
      }
      if (local_b0.allocator != (Allocator *)0x0) {
        (*(local_b0.allocator)->_vptr_Allocator[3])();
        return;
      }
      goto LAB_00328559;
    }
  }
  Mat::reshape(&local_b0,weight_data,num_input,num_output,(Allocator *)0x0);
  cast_float32_to_float16(&local_b0,weight_data_tm,opt);
  if (local_b0.refcount == (int *)0x0) {
    return;
  }
  LOCK();
  *local_b0.refcount = *local_b0.refcount + -1;
  UNLOCK();
  if (*local_b0.refcount != 0) {
    return;
  }
  if (local_b0.allocator != (Allocator *)0x0) {
    (*(local_b0.allocator)->_vptr_Allocator[3])();
    return;
  }
LAB_00328559:
  if (local_b0.data != (void *)0x0) {
    free(local_b0.data);
  }
  return;
}

Assistant:

void innerproduct_transform_kernel_fp16s_sse_f16c(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, const Option& opt)
{
    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);
}